

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O3

void __thiscall
hanabi_learning_env::HanabiHand::RemoveFromHand
          (HanabiHand *this,int card_index,
          vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
          *discard_pile)

{
  pointer *ppHVar1;
  iterator __position;
  pointer pHVar2;
  HanabiCard *__args;
  pointer pHVar3;
  pointer __src;
  long lVar4;
  
  lVar4 = (long)card_index;
  if (discard_pile !=
      (vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *)
      0x0) {
    __args = (this->cards_).
             super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4;
    __position._M_current =
         (discard_pile->
         super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (discard_pile->
        super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<hanabi_learning_env::HanabiCard,std::allocator<hanabi_learning_env::HanabiCard>>::
      _M_realloc_insert<hanabi_learning_env::HanabiCard_const&>
                ((vector<hanabi_learning_env::HanabiCard,std::allocator<hanabi_learning_env::HanabiCard>>
                  *)discard_pile,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      ppHVar1 = &(discard_pile->
                 super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
  }
  pHVar2 = (this->cards_).
           super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar3 = (this->cards_).
           super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __src = pHVar2 + lVar4 + 1;
  if (__src != pHVar3) {
    memmove(pHVar2 + lVar4,__src,(long)pHVar3 - (long)__src);
    pHVar3 = (this->cards_).
             super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  (this->cards_).
  super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  ._M_impl.super__Vector_impl_data._M_finish = pHVar3 + -1;
  std::
  vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ::_M_erase(&this->card_knowledge_,
             (this->card_knowledge_).
             super__Vector_base<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4);
  return;
}

Assistant:

void HanabiHand::RemoveFromHand(int card_index,
                                std::vector<HanabiCard>* discard_pile) {
  if (discard_pile != nullptr) {
    discard_pile->push_back(cards_[card_index]);
  }
  cards_.erase(cards_.begin() + card_index);
  card_knowledge_.erase(card_knowledge_.begin() + card_index);
}